

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeHeadTrackerDevice.cpp
# Opt level: O2

VRInputDevice *
MinVR::VRFakeHeadTrackerDevice::create
          (VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  float fVar1;
  float fVar2;
  float r1c3;
  float r2c1;
  float r2c2;
  float r2c3;
  float r3c1;
  float r3c2;
  bool bVar3;
  VRAnyCoreType VVar4;
  float *pfVar5;
  ostream *poVar6;
  VRFakeHeadTrackerDevice *this;
  float tScale;
  float rScale;
  VRMatrix4 M1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mouseRotKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rightKeys;
  string devNameSpace;
  VRVector3 z;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forwardKeys;
  VRVector3 x;
  VRVector3 center;
  VRMatrix4 headMatrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  backKeys;
  VRVector3 y;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  leftKeys;
  string local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  string local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string toggleEvent;
  string local_b8;
  string trackerName;
  VRMatrix4 local_78;
  
  std::__cxx11::string::string((string *)&devNameSpace,(string *)nameSpace);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&headMatrix,"TrackerName",(allocator<char> *)&M1);
  std::__cxx11::string::string((string *)&local_b8,(string *)&devNameSpace);
  VVar4 = VRDataIndex::getValue(config,(string *)&headMatrix,&local_b8,true);
  (*(VVar4.datum)->_vptr_VRDatum[2])(&trackerName,VVar4.datum);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&headMatrix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&headMatrix,"ToggleOnOffEvent",(allocator<char> *)&forwardKeys);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"Kbd1_Down",(allocator<char> *)&backKeys);
  std::__cxx11::string::string((string *)&local_f8,(string *)&devNameSpace);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&toggleEvent,config,(string *)&headMatrix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M1,&local_f8,true
            );
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&M1);
  std::__cxx11::string::~string((string *)&headMatrix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&headMatrix,"TranslationScale",(allocator<char> *)&forwardKeys);
  M1.super_VRFloatArrayConvertible._vptr_VRFloatArrayConvertible._0_4_ = 0x3f800000;
  std::__cxx11::string::string((string *)&local_118,(string *)&devNameSpace);
  tScale = VRDataIndex::getValueWithDefault<float>
                     (config,(string *)&headMatrix,(float *)&M1,&local_118,true);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&headMatrix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&headMatrix,"RotationScale",(allocator<char> *)&forwardKeys);
  M1.super_VRFloatArrayConvertible._vptr_VRFloatArrayConvertible._0_4_ = 0x3f800000;
  std::__cxx11::string::string((string *)&local_138,(string *)&devNameSpace);
  rScale = VRDataIndex::getValueWithDefault<float>
                     (config,(string *)&headMatrix,(float *)&M1,&local_138,true);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&headMatrix);
  VRVector3::VRVector3((VRVector3 *)&M1,0.0,0.0,4.0);
  VRMatrix4::translation(&headMatrix,(VRVector3 *)&M1);
  VRVector3::~VRVector3((VRVector3 *)&M1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"HeadMatrix",(allocator<char> *)&forwardKeys);
  std::__cxx11::string::string((string *)&local_158,(string *)&devNameSpace);
  bVar3 = VRDataIndex::exists(config,(string *)&M1,&local_158,true);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&M1);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&forwardKeys,"HeadMatrix",(allocator<char> *)&backKeys);
    std::__cxx11::string::string((string *)&local_178,(string *)&devNameSpace);
    VVar4 = VRDataIndex::getValue(config,(string *)&forwardKeys,&local_178,true);
    VRMatrix4::VRMatrix4(&M1,VVar4);
    VRMatrix4::operator=(&headMatrix,&M1);
    VRMatrix4::~VRMatrix4(&M1);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&forwardKeys);
    goto LAB_00139562;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"LookAtUp",(allocator<char> *)&leftKeys);
  std::__cxx11::string::string((string *)&local_350,(string *)&devNameSpace);
  bVar3 = VRDataIndex::exists(config,(string *)&M1,&local_350,true);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&forwardKeys,"LookAtEye",(allocator<char> *)&rightKeys);
    std::__cxx11::string::string((string *)&local_300,(string *)&devNameSpace);
    bVar3 = VRDataIndex::exists(config,(string *)&forwardKeys,&local_300,true);
    if (!bVar3) {
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&forwardKeys);
      goto LAB_001394da;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&backKeys,"LookAtCenter",(allocator<char> *)&mouseRotKeys);
    std::__cxx11::string::string((string *)&local_198,(string *)&devNameSpace);
    bVar3 = VRDataIndex::exists(config,(string *)&backKeys,&local_198,true);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&backKeys);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&forwardKeys);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&M1);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&M1,"LookAtUp",(allocator<char> *)&forwardKeys);
      std::__cxx11::string::string((string *)&local_1b8,(string *)&devNameSpace);
      VVar4 = VRDataIndex::getValue(config,(string *)&M1,&local_1b8,true);
      VRVector3::VRVector3((VRVector3 *)&rightKeys,VVar4);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&M1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&M1,"LookAtEye",(allocator<char> *)&forwardKeys);
      std::__cxx11::string::string((string *)&local_1d8,(string *)&devNameSpace);
      VVar4 = VRDataIndex::getValue(config,(string *)&M1,&local_1d8,true);
      VRVector3::VRVector3((VRVector3 *)&mouseRotKeys,VVar4);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&M1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&M1,"LookAtCenter",(allocator<char> *)&forwardKeys);
      std::__cxx11::string::string((string *)&local_1f8,(string *)&devNameSpace);
      VVar4 = VRDataIndex::getValue(config,(string *)&M1,&local_1f8,true);
      VRVector3::VRVector3(&center,VVar4);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&M1);
      operator-(&z,(VRVector3 *)&mouseRotKeys,&center);
      VRVector3::normalize((VRVector3 *)&M1,&z);
      VRVector3::operator=(&z,(VRVector3 *)&M1);
      VRVector3::~VRVector3((VRVector3 *)&M1);
      VRVector3::cross(&x,(VRVector3 *)&rightKeys,&z);
      VRVector3::normalize((VRVector3 *)&M1,&x);
      VRVector3::operator=(&x,(VRVector3 *)&M1);
      VRVector3::~VRVector3((VRVector3 *)&M1);
      VRVector3::cross(&y,&z,&x);
      pfVar5 = VRVector3::operator[](&x,0);
      fVar1 = *pfVar5;
      pfVar5 = VRVector3::operator[](&y,0);
      fVar2 = *pfVar5;
      pfVar5 = VRVector3::operator[](&z,0);
      r1c3 = *pfVar5;
      pfVar5 = VRVector3::operator[](&x,1);
      r2c1 = *pfVar5;
      pfVar5 = VRVector3::operator[](&y,1);
      r2c2 = *pfVar5;
      pfVar5 = VRVector3::operator[](&z,1);
      r2c3 = *pfVar5;
      pfVar5 = VRVector3::operator[](&x,2);
      r3c1 = *pfVar5;
      pfVar5 = VRVector3::operator[](&y,2);
      r3c2 = *pfVar5;
      pfVar5 = VRVector3::operator[](&z,2);
      VRMatrix4::fromRowMajorElements
                (&M1,fVar1,fVar2,r1c3,0.0,r2c1,r2c2,r2c3,0.0,r3c1,r3c2,*pfVar5,0.0,0.0,0.0,0.0,1.0);
      pfVar5 = VRVector3::operator[]((VRVector3 *)&mouseRotKeys,0);
      fVar1 = *pfVar5;
      pfVar5 = VRVector3::operator[]((VRVector3 *)&mouseRotKeys,1);
      fVar2 = *pfVar5;
      pfVar5 = VRVector3::operator[]((VRVector3 *)&mouseRotKeys,2);
      VRMatrix4::fromRowMajorElements
                ((VRMatrix4 *)&forwardKeys,1.0,0.0,0.0,-fVar1,0.0,1.0,0.0,-fVar2,0.0,0.0,1.0,
                 -*pfVar5,0.0,0.0,0.0,1.0);
      operator*((VRMatrix4 *)&backKeys,&M1,(VRMatrix4 *)&forwardKeys);
      VRMatrix4::inverse((VRMatrix4 *)&leftKeys,(VRMatrix4 *)&backKeys);
      VRMatrix4::operator=(&headMatrix,(VRMatrix4 *)&leftKeys);
      VRMatrix4::~VRMatrix4((VRMatrix4 *)&leftKeys);
      VRMatrix4::~VRMatrix4((VRMatrix4 *)&backKeys);
      VRMatrix4::~VRMatrix4((VRMatrix4 *)&forwardKeys);
      VRMatrix4::~VRMatrix4(&M1);
      VRVector3::~VRVector3(&y);
      VRVector3::~VRVector3(&x);
      VRVector3::~VRVector3(&z);
      VRVector3::~VRVector3(&center);
      VRVector3::~VRVector3((VRVector3 *)&mouseRotKeys);
      VRVector3::~VRVector3((VRVector3 *)&rightKeys);
      goto LAB_00139562;
    }
  }
  else {
LAB_001394da:
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&M1);
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"Warning : no HeadMatrix defined for ");
  poVar6 = std::operator<<(poVar6,(string *)&devNameSpace);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cerr,
                           "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cerr,"Using default: ");
  poVar6 = operator<<(poVar6,&headMatrix);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_00139562:
  forwardKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  forwardKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  forwardKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"KbdUp",(allocator<char> *)&backKeys);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&forwardKeys,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M1);
  std::__cxx11::string::~string((string *)&M1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"KbdW",(allocator<char> *)&backKeys);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&forwardKeys,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M1);
  std::__cxx11::string::~string((string *)&M1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"ForwardKeys",(allocator<char> *)&leftKeys);
  std::__cxx11::string::string((string *)&local_218,(string *)&devNameSpace);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&backKeys,config,(string *)&M1,&forwardKeys,&local_218,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&forwardKeys,&backKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&backKeys);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&M1);
  backKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  backKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  backKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"KbdDown",(allocator<char> *)&leftKeys);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&backKeys,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M1);
  std::__cxx11::string::~string((string *)&M1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"KbdZ",(allocator<char> *)&leftKeys);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&backKeys,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M1);
  std::__cxx11::string::~string((string *)&M1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"BackKeys",(allocator<char> *)&rightKeys);
  std::__cxx11::string::string((string *)&local_238,(string *)&devNameSpace);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&leftKeys,config,(string *)&M1,&backKeys,&local_238,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&backKeys,&leftKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&leftKeys);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&M1);
  leftKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  leftKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  leftKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"KbdLeft",(allocator<char> *)&rightKeys);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&leftKeys,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M1);
  std::__cxx11::string::~string((string *)&M1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"KbdA",(allocator<char> *)&rightKeys);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&leftKeys,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M1);
  std::__cxx11::string::~string((string *)&M1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"LeftKeys",(allocator<char> *)&mouseRotKeys);
  std::__cxx11::string::string((string *)&local_258,(string *)&devNameSpace);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&rightKeys,config,(string *)&M1,&leftKeys,&local_258,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&leftKeys,&rightKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&rightKeys);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&M1);
  rightKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rightKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rightKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"KbdRight",(allocator<char> *)&mouseRotKeys);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&rightKeys,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M1);
  std::__cxx11::string::~string((string *)&M1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"KbdS",(allocator<char> *)&mouseRotKeys);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&rightKeys,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M1);
  std::__cxx11::string::~string((string *)&M1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"RightKeys",(allocator<char> *)&center);
  std::__cxx11::string::string((string *)&local_278,(string *)&devNameSpace);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&mouseRotKeys,config,(string *)&M1,&rightKeys,&local_278,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&rightKeys,&mouseRotKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&mouseRotKeys);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&M1);
  mouseRotKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mouseRotKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mouseRotKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"MouseBtnRight",(allocator<char> *)&center);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&mouseRotKeys,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M1);
  std::__cxx11::string::~string((string *)&M1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"MouseRotationKeys",(allocator<char> *)&z);
  std::__cxx11::string::string((string *)&local_298,(string *)&devNameSpace);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&center,config,(string *)&M1,&mouseRotKeys,&local_298,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&mouseRotKeys,&center);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&center);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&M1);
  this = (VRFakeHeadTrackerDevice *)operator_new(0x1b0);
  VRMatrix4::VRMatrix4(&local_78,&headMatrix);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_318,&forwardKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_330,&backKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2b0,&leftKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2c8,&rightKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2e0,&mouseRotKeys);
  VRFakeHeadTrackerDevice
            (this,&trackerName,&toggleEvent,tScale,rScale,&local_78,&local_318,&local_330,&local_2b0
             ,&local_2c8,&local_2e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_330);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  VRMatrix4::~VRMatrix4(&local_78);
  (**vrMain->_vptr_VRMainInterface)(vrMain,&this->super_VREventHandler);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&mouseRotKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&rightKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&leftKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&backKeys);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&forwardKeys);
  VRMatrix4::~VRMatrix4(&headMatrix);
  std::__cxx11::string::~string((string *)&toggleEvent);
  std::__cxx11::string::~string((string *)&trackerName);
  std::__cxx11::string::~string((string *)&devNameSpace);
  return &this->super_VRInputDevice;
}

Assistant:

VRInputDevice*
VRFakeHeadTrackerDevice::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace) {
    std::string devNameSpace = nameSpace;
  
    std::string trackerName = config->getValue("TrackerName", devNameSpace);
    std::string toggleEvent = config->getValueWithDefault("ToggleOnOffEvent", std::string("Kbd1_Down"), devNameSpace);
    float tScale = config->getValueWithDefault("TranslationScale", 1.0f, devNameSpace);
    float rScale = config->getValueWithDefault("RotationScale", 1.0f, devNameSpace);
    
    VRMatrix4 headMatrix = VRMatrix4::translation(VRVector3(0,0,4));
    if (config->exists("HeadMatrix", devNameSpace)){
        headMatrix = config->getValue("HeadMatrix", devNameSpace);
    }
    else if (config->exists("LookAtUp", devNameSpace) && config->exists("LookAtEye", devNameSpace) && config->exists("LookAtCenter", devNameSpace))
    {
        VRVector3 up = config->getValue("LookAtUp", devNameSpace);
        VRVector3 eye = config->getValue("LookAtEye", devNameSpace);
        VRVector3 center = config->getValue("LookAtCenter", devNameSpace);
        
        VRVector3 z = eye - center;
        z = z.normalize();
        VRVector3 x = up.cross(z);
        x = x.normalize();
        VRVector3 y = z.cross(x);
        
        VRMatrix4 M1 = VRMatrix4::fromRowMajorElements(x[0], y[0], z[0], 0,
                                                       x[1], y[1], z[1], 0,
                                                       x[2], y[2], z[2], 0,
                                                       0, 0, 0, 1);
        
        VRMatrix4 M2 = VRMatrix4::fromRowMajorElements(1, 0, 0, -eye[0],
                                                       0, 1, 0, -eye[1],
                                                       0, 0, 1, -eye[2],
                                                       0, 0, 0, 1);
        
        VRMatrix4 lookAtMatrix = M1 * M2;
        headMatrix = lookAtMatrix.inverse();
    }
    else {
        std::cerr << "Warning : no HeadMatrix defined for " << devNameSpace << std::endl;
        std::cerr << "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter" << std::endl;
        std::cerr << "Using default: " << headMatrix << std::endl;
    }
    
    std::vector<std::string> forwardKeys;
    forwardKeys.push_back("KbdUp");
    forwardKeys.push_back("KbdW");
    forwardKeys = config->getValueWithDefault("ForwardKeys", forwardKeys, devNameSpace);
    
    std::vector<std::string> backKeys;
    backKeys.push_back("KbdDown");
    backKeys.push_back("KbdZ");
    backKeys = config->getValueWithDefault("BackKeys", backKeys, devNameSpace);
    
    std::vector<std::string> leftKeys;
    leftKeys.push_back("KbdLeft");
    leftKeys.push_back("KbdA");
    leftKeys = config->getValueWithDefault("LeftKeys", leftKeys, devNameSpace);
    
    std::vector<std::string> rightKeys;
    rightKeys.push_back("KbdRight");
    rightKeys.push_back("KbdS");
    rightKeys = config->getValueWithDefault("RightKeys", rightKeys, devNameSpace);

    std::vector<std::string> mouseRotKeys;
    mouseRotKeys.push_back("MouseBtnRight");
    mouseRotKeys = config->getValueWithDefault("MouseRotationKeys", mouseRotKeys, devNameSpace);
    
    VRFakeHeadTrackerDevice *dev = new VRFakeHeadTrackerDevice(trackerName, toggleEvent, tScale, rScale,
        headMatrix, forwardKeys, backKeys, leftKeys, rightKeys, mouseRotKeys);
    vrMain->addEventHandler(dev);

    return dev;
}